

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O1

bool DiffDistTest2<unsigned_long,unsigned_long>(pfHash hash,bool drawDiagram)

{
  bool bVar1;
  value_type_conflict3 *__val;
  void *__s;
  int keybit;
  uint bit;
  bool bVar2;
  int i;
  long lVar3;
  unsigned_long h2;
  unsigned_long h1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  unsigned_long k;
  ulong local_78;
  ulong local_70;
  undefined1 local_68 [16];
  pointer local_58;
  Rand local_48;
  undefined1 local_38 [8];
  
  local_48.x = 0x407129e7;
  local_48.y = 0x7888093c;
  local_48.z = 0x760425e2;
  local_48.w = 0x898677b9;
  local_68 = ZEXT816(0) << 0x20;
  local_58 = (pointer)0x0;
  __s = operator_new(0x1000000);
  local_68._8_8_ = __s;
  local_68._0_8_ = __s;
  local_58 = (pointer)((long)__s + 0x1000000);
  memset(__s,0,0x1000000);
  local_68._8_8_ = (pointer)((long)__s + 0x1000000);
  bVar2 = true;
  bit = 0;
  do {
    printf("Testing bit %d\n",(ulong)bit);
    lVar3 = 0;
    do {
      Rand::rand_p(&local_48,local_38,8);
      (*hash)(local_38,8,0,&local_70);
      flipbit(local_38,8,bit);
      (*hash)(local_38,8,0,&local_78);
      *(ulong *)(local_68._0_8_ + lVar3 * 8) = local_78 ^ local_70;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x200000);
    bVar1 = TestHashList<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_68,true,true,
                       drawDiagram,true,true);
    bVar2 = (bool)(bVar2 & bVar1);
    putchar(10);
    bit = bit + 1;
  } while (bit != 0x40);
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_);
  }
  return bVar2;
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}